

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

void __thiscall
ON_SubDMeshImpl::ClearFragmentFacePointers(ON_SubDMeshImpl *this,bool bResetSubDWeakPtr)

{
  ON_SubDMeshFragment *local_20;
  ON_SubDMeshFragment *fragment;
  bool bResetSubDWeakPtr_local;
  ON_SubDMeshImpl *this_local;
  
  if (bResetSubDWeakPtr) {
    std::__weak_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->m_subdimple_wp).super___weak_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>);
  }
  if ((this->m_first_fragment != (ON_SubDMeshFragment *)0x0) &&
     (this->m_first_fragment->m_face != (ON_SubDFace *)0x0)) {
    for (local_20 = this->m_first_fragment; local_20 != (ON_SubDMeshFragment *)0x0;
        local_20 = local_20->m_next_fragment) {
      local_20->m_face = (ON_SubDFace *)0x0;
    }
  }
  return;
}

Assistant:

void ON_SubDMeshImpl::ClearFragmentFacePointers(
  bool bResetSubDWeakPtr
)
{
  // When the ON_SubDimple that manages the faces referenced by
  // fragment->m_face is deleted, fragment->m_face must be set to zero.
  if (bResetSubDWeakPtr)
    m_subdimple_wp.reset();
  if (nullptr != m_first_fragment && nullptr != m_first_fragment->m_face)
  {
    for (auto fragment = m_first_fragment; nullptr != fragment; fragment = fragment->m_next_fragment)
      fragment->m_face = nullptr;
  }
}